

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

void __thiscall LinkedObjectFile::find_code(LinkedObjectFile *this)

{
  uint32_t *puVar1;
  long lVar2;
  pointer pLVar3;
  pointer pLVar4;
  int iVar5;
  int *piVar6;
  pointer pvVar7;
  uint uVar8;
  ulong uVar9;
  pointer pvVar10;
  bool bVar11;
  pointer puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  string *psVar19;
  pointer pLVar20;
  
  iVar5 = this->segments;
  if (iVar5 != 0) {
    if (iVar5 == 1) {
      pvVar7 = (this->words_by_seg).
               super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar4 = *(pointer *)
                ((long)&(pvVar7->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                        _M_impl.super__Vector_impl_data + 8);
      pLVar20 = (pvVar7->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl.
                super__Vector_impl_data._M_start;
      while (pLVar20 != pLVar4) {
        psVar19 = (string *)((long)pLVar20 + 0x10);
        if ((psVar19->_M_string_length != 0) &&
           (iVar5 = std::__cxx11::string::compare((char *)psVar19), iVar5 == 0)) {
          __assert_fail("word.symbol_name != \"function\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x122,"void LinkedObjectFile::find_code()");
        }
        pLVar20 = (pointer)(psVar19 + 1);
      }
      puVar12 = (this->offset_of_data_zone_by_seg).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->offset_of_data_zone_by_seg).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar12) {
        uVar9 = 0;
        uVar13 = 0;
LAB_0012e541:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar13,uVar9);
      }
      *puVar12 = 0;
      pvVar7 = (this->words_by_seg).
               super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->stats).data_bytes =
           (int)((ulong)((long)*(pointer *)
                                ((long)&(pvVar7->
                                        super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)
                                        ._M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(pvVar7->
                                  super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                                  _M_impl.super__Vector_impl_data) >> 4) * -0x55555554;
      (this->stats).code_bytes = 0;
    }
    else {
      if (iVar5 != 3) {
        __assert_fail("segments == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0x167,"void LinkedObjectFile::find_code()");
      }
      pvVar7 = (this->words_by_seg).
               super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar10 = (this->words_by_seg).
                super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar18 = 0;
      do {
        uVar9 = ((long)pvVar10 - (long)pvVar7 >> 3) * -0x5555555555555555;
        uVar13 = uVar18;
        if (uVar9 < uVar18 || uVar9 - uVar18 == 0) goto LAB_0012e541;
        lVar15 = (long)*(pointer *)
                        ((long)&pvVar7[uVar18].
                                super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                                super__Vector_impl_data + 8) -
                 *(long *)&pvVar7[uVar18].
                           super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                           super__Vector_impl_data;
        if (lVar15 != 0) {
          uVar17 = (lVar15 >> 4) * -0x5555555555555555;
          lVar16 = lVar15 + -0x2c;
LAB_0012e1ac:
          uVar17 = uVar17 - 1;
          lVar15 = lVar15 + -0x30;
          pvVar7 = (this->words_by_seg).
                   super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = ((long)(this->words_by_seg).
                         super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
                  -0x5555555555555555;
          uVar13 = uVar18;
          if (uVar18 <= uVar9 && uVar9 - uVar18 != 0) {
            lVar2 = *(long *)&pvVar7[uVar18].
                              super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                              super__Vector_impl_data;
            uVar9 = ((long)*(pointer *)
                            ((long)&pvVar7[uVar18].
                                    super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                    _M_impl.super__Vector_impl_data + 8) - lVar2 >> 4) *
                    -0x5555555555555555;
            uVar13 = uVar17;
            if (uVar17 <= uVar9 && uVar9 - uVar17 != 0) {
              if ((*(int *)(lVar2 + lVar15) != 7) ||
                 (iVar5 = std::__cxx11::string::compare((char *)(lVar2 + lVar15 + 0x10)), iVar5 != 0
                 )) goto LAB_0012e20d;
              pvVar7 = (this->words_by_seg).
                       super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar9 = ((long)(this->words_by_seg).
                             super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
                      -0x5555555555555555;
              uVar13 = uVar18;
              if (uVar18 <= uVar9 && uVar9 - uVar18 != 0) {
                lVar15 = *(long *)&pvVar7[uVar18].
                                   super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                   _M_impl.super__Vector_impl_data;
                uVar9 = ((long)*(pointer *)
                                ((long)&pvVar7[uVar18].
                                        super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                        _M_impl.super__Vector_impl_data + 8) - lVar15 >> 4) *
                        -0x5555555555555555;
                if (uVar17 < uVar9) {
                  piVar6 = (int *)(lVar15 + lVar16);
                  uVar14 = 0xffffffffffffffff;
                  bVar11 = false;
                  do {
                    if (*piVar6 == 0x3e00008 && piVar6[-1] == 0) {
                      uVar14 = uVar17;
                    }
                    bVar11 = (bool)(bVar11 | (*piVar6 == 0x3e00008 && piVar6[-1] == 0));
                    uVar17 = uVar17 + 1;
                    piVar6 = piVar6 + 0xc;
                  } while (uVar17 < uVar9);
                }
                else {
                  uVar14 = 0xffffffffffffffff;
                  bVar11 = false;
                }
                if (!bVar11) {
                  __assert_fail("found_jr_ra",
                                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                                ,0x14a,"void LinkedObjectFile::find_code()");
                }
                if (uVar9 <= uVar14 + 1) {
                  __assert_fail("jr_ra_loc + 1 < words_by_seg.at(i).size()",
                                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                                ,0x14b,"void LinkedObjectFile::find_code()");
                }
                puVar12 = (this->offset_of_data_zone_by_seg).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar17 = (long)(this->offset_of_data_zone_by_seg).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 2;
                uVar9 = uVar17;
                if (uVar17 <= uVar18) goto LAB_0012e541;
                uVar8 = (int)uVar14 + 2;
                goto LAB_0012e2e0;
              }
            }
          }
          goto LAB_0012e541;
        }
LAB_0012e21b:
        puVar12 = (this->offset_of_data_zone_by_seg).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar17 = (long)(this->offset_of_data_zone_by_seg).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar12 >> 2;
        uVar8 = 0;
        uVar9 = uVar17;
        uVar13 = uVar18;
        if (uVar17 <= uVar18) goto LAB_0012e541;
LAB_0012e2e0:
        puVar12[uVar18] = uVar8;
        pvVar7 = (this->words_by_seg).
                 super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = ((long)(this->words_by_seg).
                       super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
                -0x5555555555555555;
        uVar13 = uVar18;
        if (uVar9 < uVar18 || uVar9 - uVar18 == 0) goto LAB_0012e541;
        uVar9 = ((long)*(pointer *)
                        ((long)&pvVar7[uVar18].
                                super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                                super__Vector_impl_data + 8) -
                 *(long *)&pvVar7[uVar18].
                           super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                           super__Vector_impl_data >> 4) * -0x5555555555555555;
        if (uVar8 <= uVar9 && uVar9 - uVar8 != 0) {
          iVar5 = get_label_id_for(this,(int)uVar18,uVar8 << 2);
          uVar13 = (ulong)iVar5;
          pLVar3 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) *
                  -0x3333333333333333;
          if (uVar9 < uVar13 || uVar9 - uVar13 == 0) goto LAB_0012e541;
          pLVar3 = pLVar3 + uVar13;
          std::__cxx11::string::_M_replace
                    ((ulong)pLVar3,0,(char *)(pLVar3->name)._M_string_length,0x149a4f);
          puVar12 = (this->offset_of_data_zone_by_seg).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar17 = (long)(this->offset_of_data_zone_by_seg).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar12 >> 2;
        }
        uVar9 = uVar17;
        uVar13 = uVar18;
        if (uVar17 <= uVar18) goto LAB_0012e541;
        pvVar7 = (this->words_by_seg).
                 super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar10 = (this->words_by_seg).
                  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar9 = ((long)pvVar10 - (long)pvVar7 >> 3) * -0x5555555555555555;
        if (uVar9 < uVar18 || uVar9 - uVar18 == 0) goto LAB_0012e541;
        uVar17 = (ulong)puVar12[uVar18] - 1;
        lVar15 = (ulong)puVar12[uVar18] * 0x30 + 0x10;
        while( true ) {
          lVar16 = *(long *)&pvVar7[uVar18].
                             super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                             super__Vector_impl_data;
          uVar14 = ((long)*(pointer *)
                           ((long)&pvVar7[uVar18].
                                   super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                   _M_impl.super__Vector_impl_data + 8) - lVar16 >> 4) *
                   -0x5555555555555555;
          uVar17 = uVar17 + 1;
          if (uVar14 <= uVar17) break;
          if (*(int *)(lVar16 + -0x10 + lVar15) == 7) {
            iVar5 = std::__cxx11::string::compare((char *)(lVar16 + lVar15));
            if (iVar5 == 0) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                            ,0x15d,"void LinkedObjectFile::find_code()");
            }
            pvVar7 = (this->words_by_seg).
                     super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar10 = (this->words_by_seg).
                      super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          lVar15 = lVar15 + 0x30;
          uVar9 = ((long)pvVar10 - (long)pvVar7 >> 3) * -0x5555555555555555;
          if (uVar9 < uVar18 || uVar9 - uVar18 == 0) goto LAB_0012e541;
        }
        puVar12 = (this->offset_of_data_zone_by_seg).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = (long)(this->offset_of_data_zone_by_seg).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar12 >> 2;
        if (uVar9 <= uVar18) goto LAB_0012e541;
        puVar1 = &(this->stats).data_bytes;
        *puVar1 = *puVar1 + ((int)uVar14 - puVar12[uVar18]) * 0x10;
        puVar1 = &(this->stats).code_bytes;
        *puVar1 = *puVar1 + puVar12[uVar18] * 4;
        uVar18 = uVar18 + 1;
      } while ((long)uVar18 < (long)this->segments);
    }
  }
  return;
LAB_0012e20d:
  lVar16 = lVar16 + -0x30;
  if (uVar17 == 0) goto LAB_0012e21b;
  goto LAB_0012e1ac;
}

Assistant:

void LinkedObjectFile::find_code() {
  if (segments == 1) {
    // single segment object files should never have any code.
    auto& seg = words_by_seg.front();
    for (auto& word : seg) {
      if (!word.symbol_name.empty()) {
        assert(word.symbol_name != "function");
      }
    }
    offset_of_data_zone_by_seg.at(0) = 0;
    stats.data_bytes = words_by_seg.front().size() * 4;
    stats.code_bytes = 0;

  } else if (segments == 3) {
    // V3 object files will have all the functions, then all the static data.  So to find the
    // divider, we look for the last "function" tag, then find the last jr $ra instruction after
    // that (plus one for delay slot) and assume that after that is data.  Additionally, we check to
    // make sure that there are no "function" type tags in the data section, although this is
    // redundant.
    for (int i = 0; i < segments; i++) {
      // try to find the last reference to "function":
      bool found_function = false;
      size_t function_loc = -1;
      for (size_t j = words_by_seg.at(i).size(); j-- > 0;) {
        auto& word = words_by_seg.at(i).at(j);
        if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
          function_loc = j;
          found_function = true;
          break;
        }
      }

      if (found_function) {
        // look forward until we find "jr ra"
        const uint32_t jr_ra = 0x3e00008;
        bool found_jr_ra = false;
        size_t jr_ra_loc = -1;

        for (size_t j = function_loc; j < words_by_seg.at(i).size(); j++) {
          auto& word = words_by_seg.at(i).at(j);
          if (word.kind == LinkedWord::PLAIN_DATA && word.data == jr_ra) {
            found_jr_ra = true;
            jr_ra_loc = j;
          }
        }

        assert(found_jr_ra);
        assert(jr_ra_loc + 1 < words_by_seg.at(i).size());
        offset_of_data_zone_by_seg.at(i) = jr_ra_loc + 2;

      } else {
        // no functions
        offset_of_data_zone_by_seg.at(i) = 0;
      }

      // add label for debug purposes
      if (offset_of_data_zone_by_seg.at(i) < words_by_seg.at(i).size()) {
        auto data_label_id = get_label_id_for(i, 4 * (offset_of_data_zone_by_seg.at(i)));
        labels.at(data_label_id).name = "L-data-start";
      }

      // verify there are no functions after the data section starts
      for (size_t j = offset_of_data_zone_by_seg.at(i); j < words_by_seg.at(i).size(); j++) {
        auto& word = words_by_seg.at(i).at(j);
        if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
          assert(false);
        }
      }

      // sizes:
      stats.data_bytes += 4 * (words_by_seg.at(i).size() - offset_of_data_zone_by_seg.at(i)) * 4;
      stats.code_bytes += 4 * offset_of_data_zone_by_seg.at(i);
    }
  } else {
    // for files which we couldn't extract link data yet, they will have 0 segments and its ok.
    assert(segments == 0);
  }
}